

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTree.cpp
# Opt level: O2

void __thiscall
ASTree::ASTree(ASTree *this,
              stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>
              *productions,
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *nonTerminals,string *newRoot,ASTree *parent)

{
  Production *this_00;
  const_iterator cVar1;
  __type _Var2;
  _Elt_pointer ppPVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar4;
  ulong uVar5;
  const_iterator cVar6;
  ASTree *pAVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  long local_100;
  ASTree *local_e8;
  string prodToJ;
  string local_c0;
  string local_a0;
  stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_> emptyStack;
  
  (this->subtrees).super__Vector_base<ASTree_*,_std::allocator<ASTree_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->subtrees).super__Vector_base<ASTree_*,_std::allocator<ASTree_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->subtrees).super__Vector_base<ASTree_*,_std::allocator<ASTree_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&this->root,(string *)newRoot);
  this->parent = parent;
  ppPVar3 = (productions->c).super__Deque_base<Production_*,_std::allocator<Production_*>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur;
  if (ppPVar3 !=
      (productions->c).super__Deque_base<Production_*,_std::allocator<Production_*>_>._M_impl.
      super__Deque_impl_data._M_start._M_cur) {
    if (ppPVar3 ==
        (productions->c).super__Deque_base<Production_*,_std::allocator<Production_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppPVar3 = (productions->c).super__Deque_base<Production_*,_std::allocator<Production_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    this_00 = ppPVar3[-1];
    std::deque<Production_*,_std::allocator<Production_*>_>::pop_back(&productions->c);
    pvVar4 = Production::getToP_abi_cxx11_(this_00);
    uVar8 = (long)(pvVar4->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(pvVar4->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
    uVar5 = uVar8 >> 5;
    uVar9 = 0;
    if (0 < (int)uVar5) {
      uVar9 = uVar5 & 0xffffffff;
    }
    local_100 = uVar8 * 0x8000000;
    while( true ) {
      local_100 = local_100 + -0x100000000;
      bVar10 = uVar9 == 0;
      uVar9 = uVar9 - 1;
      if (bVar10) break;
      pvVar4 = Production::getToP_abi_cxx11_(this_00);
      std::__cxx11::string::string
                ((string *)&prodToJ,
                 (string *)
                 ((long)&(((pvVar4->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                 (local_100 >> 0x1b)));
      getMarker_abi_cxx11_();
      _Var2 = std::operator==(&prodToJ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&emptyStack);
      std::__cxx11::string::~string((string *)&emptyStack);
      if (!_Var2) {
        cVar6 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find(&nonTerminals->_M_t,&prodToJ);
        if ((_Rb_tree_header *)cVar6._M_node == &(nonTerminals->_M_t)._M_impl.super__Rb_tree_header)
        {
          std::stack<Production*,std::deque<Production*,std::allocator<Production*>>>::
          stack<std::deque<Production*,std::allocator<Production*>>,void>(&emptyStack);
          cVar1._M_current =
               (this->subtrees).super__Vector_base<ASTree_*,_std::allocator<ASTree_*>_>._M_impl.
               super__Vector_impl_data._M_start;
          pAVar7 = (ASTree *)operator_new(0x40);
          std::__cxx11::string::string((string *)&local_c0,(string *)&prodToJ);
          ASTree(pAVar7,&emptyStack,nonTerminals,&local_c0,this);
          local_e8 = pAVar7;
          std::vector<ASTree_*,_std::allocator<ASTree_*>_>::_M_insert_rval
                    (&this->subtrees,cVar1,&local_e8);
          std::__cxx11::string::~string((string *)&local_c0);
          std::_Deque_base<Production_*,_std::allocator<Production_*>_>::~_Deque_base
                    ((_Deque_base<Production_*,_std::allocator<Production_*>_> *)&emptyStack);
        }
        else {
          cVar1._M_current =
               (this->subtrees).super__Vector_base<ASTree_*,_std::allocator<ASTree_*>_>._M_impl.
               super__Vector_impl_data._M_start;
          pAVar7 = (ASTree *)operator_new(0x40);
          std::__cxx11::string::string((string *)&local_a0,(string *)&prodToJ);
          ASTree(pAVar7,productions,nonTerminals,&local_a0,this);
          emptyStack.c.super__Deque_base<Production_*,_std::allocator<Production_*>_>._M_impl.
          super__Deque_impl_data._M_map = (_Map_pointer)pAVar7;
          std::vector<ASTree_*,_std::allocator<ASTree_*>_>::_M_insert_rval
                    (&this->subtrees,cVar1,(value_type *)&emptyStack);
          std::__cxx11::string::~string((string *)&local_a0);
        }
      }
      std::__cxx11::string::~string((string *)&prodToJ);
    }
  }
  return;
}

Assistant:

ASTree::ASTree(std::stack<Production *> &productions, const std::set<std::string> &nonTerminals, std::string newRoot,
               ASTree *parent) : root(newRoot), parent(parent) {

    if (productions.empty()) { return; }

    Production *production = productions.top();
    productions.pop();

//    root = production->getFromP();

    int totProd = production->getToP().size();
    for (int j = 0; j < totProd; ++j) {

        std::string prodToJ = production->getToP()[totProd-j-1];

        if(prodToJ == getMarker()){
            continue;
        }

        if (nonTerminals.find(prodToJ) != nonTerminals.end()) {
            subtrees.insert(subtrees.begin(), new ASTree(productions, nonTerminals, prodToJ, this));
        } else {
            std::stack<Production *> emptyStack;
            subtrees.insert(subtrees.begin(), new ASTree(emptyStack, nonTerminals, prodToJ, this));
        }
    }

    return;
}